

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_avx2.c
# Opt level: O1

void av1_calc_indices_dim1_avx2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  int16_t iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [32];
  int iVar7;
  int16_t *piVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  __m256i cents [8];
  undefined1 local_140 [32];
  undefined1 local_120 [272];
  
  piVar8 = (int16_t *)local_140;
  if (0 < k) {
    uVar9 = 0;
    do {
      iVar1 = centroids[uVar9];
      *piVar8 = iVar1;
      piVar8[1] = iVar1;
      piVar8[2] = iVar1;
      piVar8[3] = iVar1;
      piVar8[4] = iVar1;
      piVar8[5] = iVar1;
      piVar8[6] = iVar1;
      piVar8[7] = iVar1;
      piVar8[8] = iVar1;
      piVar8[9] = iVar1;
      piVar8[10] = iVar1;
      piVar8[0xb] = iVar1;
      piVar8[0xc] = iVar1;
      piVar8[0xd] = iVar1;
      piVar8[0xe] = iVar1;
      piVar8[0xf] = iVar1;
      uVar9 = uVar9 + 1;
      piVar8 = piVar8 + 0x10;
    } while ((uint)k != uVar9);
  }
  if (n < 1) {
    auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    iVar7 = 0;
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar11 = vpsubw_avx2(*(undefined1 (*) [32])data,local_140);
      auVar11 = vpabsw_avx2(auVar11);
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      auVar13 = auVar12._0_32_;
      if (1 < k) {
        uVar9 = 1;
        pauVar6 = (undefined1 (*) [32])local_120;
        do {
          auVar13 = vpsubw_avx2(*(undefined1 (*) [32])data,*pauVar6);
          auVar13 = vpabsw_avx2(auVar13);
          auVar5 = vpcmpgtw_avx2(auVar11,auVar13);
          auVar11 = vpminsw_avx2(auVar11,auVar13);
          auVar13._0_2_ = (undefined2)uVar9;
          auVar13._2_2_ = auVar13._0_2_;
          auVar13._4_2_ = auVar13._0_2_;
          auVar13._6_2_ = auVar13._0_2_;
          auVar13._8_2_ = auVar13._0_2_;
          auVar13._10_2_ = auVar13._0_2_;
          auVar13._12_2_ = auVar13._0_2_;
          auVar13._14_2_ = auVar13._0_2_;
          auVar13._16_2_ = auVar13._0_2_;
          auVar13._18_2_ = auVar13._0_2_;
          auVar13._20_2_ = auVar13._0_2_;
          auVar13._22_2_ = auVar13._0_2_;
          auVar13._24_2_ = auVar13._0_2_;
          auVar13._26_2_ = auVar13._0_2_;
          auVar13._28_2_ = auVar13._0_2_;
          auVar13._30_2_ = auVar13._0_2_;
          auVar4 = vpandn_avx2(auVar5,auVar12._0_32_);
          auVar13 = vpand_avx2(auVar5,auVar13);
          auVar13 = vpor_avx2(auVar4,auVar13);
          auVar12 = ZEXT3264(auVar13);
          uVar9 = uVar9 + 1;
          pauVar6 = pauVar6 + 1;
        } while ((uint)k != uVar9);
      }
      auVar2 = vpackuswb_avx(auVar13._0_16_,auVar13._16_16_);
      *(undefined1 (*) [16])indices = auVar2;
      if (total_dist != (int64_t *)0x0) {
        auVar11 = vpmaddwd_avx2(auVar11,auVar11);
        auVar4 = vpunpckldq_avx2(auVar11,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar13 = vpunpckhdq_avx2(auVar11,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar11 = vpaddq_avx2(auVar10._0_32_,auVar4);
        auVar11 = vpaddq_avx2(auVar11,auVar13);
        auVar10 = ZEXT3264(auVar11);
      }
      auVar11 = auVar10._0_32_;
      indices = (uint8_t *)((long)indices + 0x10);
      data = (int16_t *)((long)data + 0x20);
      iVar7 = iVar7 + 0x10;
    } while (iVar7 < n);
  }
  if (total_dist != (int64_t *)0x0) {
    auVar2 = vpaddq_avx(auVar11._0_16_,auVar11._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpaddq_avx(auVar3,auVar2);
    *total_dist = auVar2._0_8_;
  }
  return;
}

Assistant:

void av1_calc_indices_dim1_avx2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m256i v_zero = _mm256_setzero_si256();
  __m256i sum = _mm256_setzero_si256();
  __m256i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    cents[j] = _mm256_set1_epi16(centroids[j]);
  }

  for (int i = 0; i < n; i += 16) {
    const __m256i in = _mm256_loadu_si256((__m256i *)data);
    __m256i ind = _mm256_setzero_si256();
    // Compute the distance to the first centroid.
    __m256i d1 = _mm256_sub_epi16(in, cents[0]);
    __m256i dist_min = _mm256_abs_epi16(d1);

    for (int j = 1; j < k; ++j) {
      // Compute the distance to the centroid.
      d1 = _mm256_sub_epi16(in, cents[j]);
      const __m256i dist = _mm256_abs_epi16(d1);
      // Compare to the minimal one.
      const __m256i cmp = _mm256_cmpgt_epi16(dist_min, dist);
      dist_min = _mm256_min_epi16(dist_min, dist);
      const __m256i ind1 = _mm256_set1_epi16(j);
      ind = _mm256_or_si256(_mm256_andnot_si256(cmp, ind),
                            _mm256_and_si256(cmp, ind1));
    }

    const __m256i p1 = _mm256_packus_epi16(ind, v_zero);
    const __m256i px = _mm256_permute4x64_epi64(p1, 0x58);
    const __m128i d2 = _mm256_extracti128_si256(px, 0);

    _mm_storeu_si128((__m128i *)indices, d2);

    if (total_dist) {
      // Square, convert to 32 bit and add together.
      dist_min = _mm256_madd_epi16(dist_min, dist_min);
      // Convert to 64 bit and add to sum.
      const __m256i dist1 = _mm256_unpacklo_epi32(dist_min, v_zero);
      const __m256i dist2 = _mm256_unpackhi_epi32(dist_min, v_zero);
      sum = _mm256_add_epi64(sum, dist1);
      sum = _mm256_add_epi64(sum, dist2);
    }

    indices += 16;
    data += 16;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_avx2(sum);
  }
}